

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O1

aiReturn __thiscall Assimp::BlobIOStream::Seek(BlobIOStream *this,size_t pOffset,aiOrigin pOrigin)

{
  ulong uVar1;
  
  if (pOrigin == aiOrigin_SET) {
    this->cursor = pOffset;
  }
  else if (pOrigin == aiOrigin_END) {
    this->cursor = this->file_size - pOffset;
  }
  else {
    if (pOrigin != aiOrigin_CUR) {
      return aiReturn_FAILURE;
    }
    this->cursor = this->cursor + pOffset;
  }
  if (this->file_size < this->cursor) {
    Grow(this,this->cursor);
  }
  uVar1 = this->file_size;
  if (this->file_size < this->cursor) {
    uVar1 = this->cursor;
  }
  this->file_size = uVar1;
  return aiReturn_SUCCESS;
}

Assistant:

virtual aiReturn Seek(size_t pOffset,
        aiOrigin pOrigin)
    {
        switch(pOrigin)
        {
        case aiOrigin_CUR:
            cursor += pOffset;
            break;

        case aiOrigin_END:
            cursor = file_size - pOffset;
            break;

        case aiOrigin_SET:
            cursor = pOffset;
            break;

        default:
            return AI_FAILURE;
        }

        if (cursor > file_size) {
            Grow(cursor);
        }

        file_size = std::max(cursor,file_size);
        return AI_SUCCESS;
    }